

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluCallLogWrapper.cpp
# Opt level: O0

ostream * __thiscall eglu::operator<<(eglu *this,ostream *str,PointerFmt<void_*> fmt)

{
  uint local_2c;
  deUint32 ndx;
  ostream *str_local;
  PointerFmt<void_*> fmt_local;
  
  if (str == (ostream *)0x0) {
    fmt_local._8_8_ = std::operator<<((ostream *)this,"(null)");
  }
  else {
    std::operator<<((ostream *)this,"{ ");
    for (local_2c = 0; local_2c < (uint)fmt.arr; local_2c = local_2c + 1) {
      if (local_2c != 0) {
        std::operator<<((ostream *)this,", ");
      }
      std::ostream::operator<<(this,*(void **)(str + (ulong)local_2c * 8));
    }
    std::operator<<((ostream *)this," }");
    fmt_local._8_8_ = this;
  }
  return (ostream *)fmt_local._8_8_;
}

Assistant:

std::ostream& operator<< (std::ostream& str, PointerFmt<T> fmt)
{
	if (fmt.arr != DE_NULL)
	{
		str << "{ ";
		for (deUint32 ndx = 0; ndx < fmt.size; ndx++)
		{
			if (ndx != 0)
				str << ", ";
			str << fmt.arr[ndx];
		}
		str << " }";
		return str;
	}
	else
		return str << "(null)";
}